

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGetProcAddressTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GetProcAddressCase::GetProcAddressCase
          (GetProcAddressCase *this,EglTestContext *eglTestCtx,char *name,char *description)

{
  Library *egl;
  TestContext *this_00;
  TestLog *log;
  char *description_local;
  char *name_local;
  EglTestContext *eglTestCtx_local;
  GetProcAddressCase *this_local;
  
  egl::TestCase::TestCase(&this->super_TestCase,eglTestCtx,name,description);
  egl = EglTestContext::getLibrary(eglTestCtx);
  this_00 = EglTestContext::getTestContext(eglTestCtx);
  log = tcu::TestContext::getLog(this_00);
  eglu::CallLogWrapper::CallLogWrapper(&this->super_CallLogWrapper,egl,log);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GetProcAddressCase_0327bf80;
  this->m_display = (EGLDisplay)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_supported);
  return;
}

Assistant:

GetProcAddressCase::GetProcAddressCase (EglTestContext& eglTestCtx, const char* name, const char* description)
	: TestCase			(eglTestCtx, name, description)
	, CallLogWrapper	(eglTestCtx.getLibrary(), eglTestCtx.getTestContext().getLog())
	, m_display			(EGL_NO_DISPLAY)
{
}